

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

int ShowDemoWindowWidgets::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *data)

{
  ImVector<char> *this;
  
  if (data->EventFlag == 0x40000) {
    this = (ImVector<char> *)data->UserData;
    if (this->Data != data->Buf) {
      __assert_fail("my_str->begin() == data->Buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                    ,0x5b2,
                    "static int ShowDemoWindowWidgets()::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *)"
                   );
    }
    ImVector<char>::resize(this,data->BufSize);
    data->Buf = this->Data;
  }
  return 0;
}

Assistant:

static int MyResizeCallback(ImGuiInputTextCallbackData* data)
                {
                    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
                    {
                        ImVector<char>* my_str = (ImVector<char>*)data->UserData;
                        IM_ASSERT(my_str->begin() == data->Buf);
                        my_str->resize(data->BufSize); // NB: On resizing calls, generally data->BufSize == data->BufTextLen + 1
                        data->Buf = my_str->begin();
                    }
                    return 0;
                }